

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_assertion_tests.cpp
# Opt level: O0

void __thiscall
iu_Expression_x_iutest_x_Monadic_Test::Body(iu_Expression_x_iutest_x_Monadic_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_4d0;
  AssertionHelper local_4b0;
  Fixed local_480;
  int local_2f8;
  ExpressionDecomposer local_2f1;
  ExpressionLHS<int> local_2f0;
  AssertionResult local_2c8;
  undefined1 local_2a0 [8];
  AssertionResult iutest_ar_1;
  AssertionHelper local_258;
  Fixed local_228;
  bool local_8a;
  ExpressionDecomposer local_89;
  ExpressionLHS<bool> local_88;
  AssertionResult local_60;
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_Expression_x_iutest_x_Monadic_Test *this_local;
  
  iutest_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  local_8a = true;
  iutest::detail::ExpressionDecomposer::operator->*(&local_88,&local_89,&local_8a);
  iutest::detail::ExpressionLHS<bool>::GetResult(&local_60,&local_88,true);
  iutest::AssertionResult::Is((AssertionResult *)local_38,&local_60);
  iutest::AssertionResult::~AssertionResult(&local_60);
  iutest::detail::ExpressionLHS<bool>::~ExpressionLHS(&local_88);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_228,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_228);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)&iutest_ar_1.m_result,(internal *)local_38,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((true))","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iutest::AssertionHelper::AssertionHelper
              (&local_258,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x28,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_258,&local_228);
    iutest::AssertionHelper::~AssertionHelper(&local_258);
    std::__cxx11::string::~string((string *)&iutest_ar_1.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_228);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  iutest::detail::AlwaysZero();
  local_2f8 = f();
  iutest::detail::ExpressionDecomposer::operator->*(&local_2f0,&local_2f1,&local_2f8);
  iutest::detail::ExpressionLHS<int>::GetResult(&local_2c8,&local_2f0,true);
  iutest::AssertionResult::Is((AssertionResult *)local_2a0,&local_2c8);
  iutest::AssertionResult::~AssertionResult(&local_2c8);
  iutest::detail::ExpressionLHS<int>::~ExpressionLHS(&local_2f0);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
  if (!bVar1) {
    memset(&local_480,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_480);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_4d0,(internal *)local_2a0,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f()))","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iutest::AssertionHelper::AssertionHelper
              (&local_4b0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x29,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_4b0,&local_480);
    iutest::AssertionHelper::~AssertionHelper(&local_4b0);
    std::__cxx11::string::~string((string *)&local_4d0);
    iutest::AssertionHelper::Fixed::~Fixed(&local_480);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
  return;
}

Assistant:

IUTEST(Expression, Monadic)
{
    IUTEST_EXPECT(true);
    IUTEST_EXPECT(f());
}